

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.h
# Opt level: O0

void pbrt::detail::
     stringPrintfRecursive<bool_const&,float_const&,float_const&,float_const&,float_const&,float_const&,float_const&>
               (string *s,char *fmt,bool *v,float *args,float *args_1,float *args_2,float *args_3,
               float *args_4,float *args_5)

{
  long lVar1;
  ulong uVar2;
  float *in_RDX;
  float *in_RSI;
  char *pcVar3;
  string *in_RDI;
  string *in_R8;
  float *in_R9;
  float *in_stack_00000008;
  bool *in_stack_00000010;
  string *in_stack_00000018;
  stringstream ss;
  bool isDFmt;
  bool isSFmt;
  bool precisionViaArg;
  string nextFmt;
  char *in_stack_fffffffffffffd68;
  string *in_stack_fffffffffffffd70;
  undefined1 *puVar4;
  char **in_stack_fffffffffffffd78;
  char **in_stack_fffffffffffffd80;
  float *in_stack_fffffffffffffd88;
  float *in_stack_fffffffffffffd90;
  float *in_stack_fffffffffffffd98;
  string local_260 [32];
  undefined8 local_240;
  string local_238 [32];
  char *in_stack_fffffffffffffde8;
  int in_stack_fffffffffffffdf4;
  char *in_stack_fffffffffffffdf8;
  LogLevel in_stack_fffffffffffffe04;
  string local_90 [32];
  undefined4 local_70;
  undefined1 local_5b;
  byte local_5a;
  byte local_59;
  float *in_stack_ffffffffffffffa8;
  float *in_stack_ffffffffffffffb0;
  float *in_stack_ffffffffffffffb8;
  float *in_stack_ffffffffffffffc0;
  
  copyToFormatString(in_stack_fffffffffffffd78,in_stack_fffffffffffffd70);
  lVar1 = std::__cxx11::string::find((char)&stack0xffffffffffffffa8,0x2a);
  local_59 = lVar1 != -1;
  lVar1 = std::__cxx11::string::find((char)&stack0xffffffffffffffa8,0x73);
  local_5a = lVar1 != -1;
  lVar1 = std::__cxx11::string::find((char)&stack0xffffffffffffffa8,100);
  local_5b = lVar1 != -1;
  if ((local_59 & 1) == 0) {
    if ((local_5a & 1) == 0) {
      if ((bool)local_5b) {
        puVar4 = &stack0xffffffffffffffa8;
        uVar2 = std::__cxx11::string::find((char)puVar4,100);
        IntegerFormatTrait<bool>::fmt();
        std::__cxx11::string::replace((ulong)puVar4,uVar2,(char *)0x1);
        std::__cxx11::string::c_str();
        formatOne<bool_const&>((char *)in_stack_fffffffffffffd88,(bool *)in_stack_fffffffffffffd80);
        std::__cxx11::string::operator+=(in_RDI,local_90);
        std::__cxx11::string::~string(local_90);
      }
      else if ((local_5a & 1) == 0) {
        uVar2 = std::__cxx11::string::empty();
        if ((uVar2 & 1) != 0) {
          LogFatal(in_stack_fffffffffffffe04,in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf4,
                   in_stack_fffffffffffffde8);
        }
        std::__cxx11::string::c_str();
        formatOne<bool_const&>((char *)in_stack_fffffffffffffd88,(bool *)in_stack_fffffffffffffd80);
        std::__cxx11::string::operator+=(in_RDI,(string *)&stack0xfffffffffffffd80);
        std::__cxx11::string::~string((string *)&stack0xfffffffffffffd80);
      }
      else {
        std::__cxx11::stringstream::stringstream((stringstream *)&stack0xfffffffffffffde8);
        std::ostream::operator<<(&stack0xfffffffffffffdf8,(bool)(*(byte *)in_RDX & 1));
        std::__cxx11::string::c_str();
        std::__cxx11::stringstream::str();
        local_240 = std::__cxx11::string::c_str();
        formatOne<char_const*>((char *)in_stack_fffffffffffffd88,in_stack_fffffffffffffd80);
        std::__cxx11::string::operator+=(in_RDI,local_238);
        std::__cxx11::string::~string(local_238);
        std::__cxx11::string::~string(local_260);
        std::__cxx11::stringstream::~stringstream((stringstream *)&stack0xfffffffffffffde8);
      }
    }
    else {
      pcVar3 = "false";
      if (((uint)*in_RDX & 1) != 0) {
        pcVar3 = "true";
      }
      std::__cxx11::string::operator+=(in_RDI,pcVar3);
    }
    stringPrintfRecursive<float_const&,float_const&,float_const&,float_const&,float_const&,float_const&>
              (in_R8,(char *)in_R9,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
               in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_RDX,in_RSI);
    local_70 = 0;
  }
  else {
    stringPrintfRecursiveWithPrecision<bool_const&,float_const&,float_const&,float_const&,float_const&,float_const&,float_const&>
              (in_stack_fffffffffffffd70,in_stack_fffffffffffffd68,in_stack_00000018,
               in_stack_00000010,in_stack_00000008,in_R9,(float *)in_stack_fffffffffffffd80,
               in_stack_fffffffffffffd88,in_stack_fffffffffffffd90,in_stack_fffffffffffffd98);
    local_70 = 1;
  }
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffa8);
  return;
}

Assistant:

inline void stringPrintfRecursive(std::string *s, const char *fmt, T &&v,
                                  Args &&... args) {
    std::string nextFmt = copyToFormatString(&fmt, s);
    bool precisionViaArg = nextFmt.find('*') != std::string::npos;

    bool isSFmt = nextFmt.find('s') != std::string::npos;
    bool isDFmt = nextFmt.find('d') != std::string::npos;

    if constexpr (std::is_integral<std::decay_t<T>>::value) {
        if (precisionViaArg) {
            stringPrintfRecursiveWithPrecision(s, fmt, nextFmt, v,
                                               std::forward<Args>(args)...);
            return;
        }
    } else if (precisionViaArg)
        LOG_FATAL("Non-integral type provided for %* format.");

    if constexpr (std::is_same<std::decay_t<T>, float>::value)
        if (nextFmt == "%f" || nextFmt == "%s") {
            *s += detail::FloatToString(v);
            goto done;
        }

    if constexpr (std::is_same<std::decay_t<T>, double>::value)
        if (nextFmt == "%f" || nextFmt == "%s") {
            *s += detail::DoubleToString(v);
            goto done;
        }

    if constexpr (std::is_same<std::decay_t<T>, bool>::value)  // FIXME: %-10s with bool
        if (isSFmt) {
            *s += bool(v) ? "true" : "false";
            goto done;
        }

    if constexpr (std::is_integral<std::decay_t<T>>::value) {
        if (isDFmt) {
            nextFmt.replace(nextFmt.find('d'), 1,
                            detail::IntegerFormatTrait<std::decay_t<T>>::fmt());
            *s += formatOne(nextFmt.c_str(), std::forward<T>(v));
            goto done;
        }
    } else if (isDFmt)
        LOG_FATAL("Non-integral type passed to %d format.");

    if (isSFmt) {
        std::stringstream ss;
        ss << v;
        *s += formatOne(nextFmt.c_str(), ss.str().c_str());
    } else if (!nextFmt.empty())
        *s += formatOne(nextFmt.c_str(), std::forward<T>(v));
    else
        LOG_FATAL("Excess values passed to Printf.");

done:
    stringPrintfRecursive(s, fmt, std::forward<Args>(args)...);
}